

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lubs.cpp
# Opt level: O2

LUBFinder wasm::LUB::getResultsLUB(Function *func,Module *wasm)

{
  PassRunner *pPVar1;
  bool bVar2;
  Function *pFVar3;
  PassRunner *pPVar4;
  Signature SVar5;
  ReFinalize local_1a0;
  undefined1 local_60 [8];
  anon_class_16_2_38787349 processReturnType;
  Type targetType;
  Type local_40;
  Type originalType;
  LUBFinder lub;
  
  originalType.id = 1;
  if (((wasm->features).features & 0x400) == 0) {
    return (LUBFinder)1;
  }
  SVar5 = HeapType::getSignature(&func->type);
  local_40 = SVar5.results.id;
  bVar2 = wasm::Type::hasPredicate<&(wasm::Type::isRef()const)>(&local_40);
  if (!bVar2) {
    return (LUBFinder)originalType.id;
  }
  ReFinalize::ReFinalize(&local_1a0);
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
            (&local_1a0.
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,func,
             wasm);
  ReFinalize::~ReFinalize(&local_1a0);
  originalType = wasm::Type::getLeastUpperBound(originalType,(func->body->type).id);
  if (originalType.id == local_40.id) {
    return (LUBFinder)originalType.id;
  }
  FindAll<wasm::Return>::FindAll((FindAll<wasm::Return> *)&local_1a0,func->body);
  pPVar1 = local_1a0.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           .super_Pass.runner;
  pPVar4 = (PassRunner *)
           local_1a0.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           .super_Pass._vptr_Pass;
  while (pPVar4 != pPVar1) {
    originalType = wasm::Type::getLeastUpperBound
                             (originalType,*(uintptr_t *)(pPVar4->_vptr_PassRunner[2] + 8));
    pPVar4 = (PassRunner *)&pPVar4->wasm;
    if (originalType.id == local_40.id) {
      std::_Vector_base<wasm::Return_*,_std::allocator<wasm::Return_*>_>::~_Vector_base
                ((_Vector_base<wasm::Return_*,_std::allocator<wasm::Return_*>_> *)&local_1a0);
      return (LUBFinder)originalType.id;
    }
  }
  std::_Vector_base<wasm::Return_*,_std::allocator<wasm::Return_*>_>::~_Vector_base
            ((_Vector_base<wasm::Return_*,_std::allocator<wasm::Return_*>_> *)&local_1a0);
  local_60 = (undefined1  [8])&originalType;
  processReturnType.lub = (LUBFinder *)&local_40;
  FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)&local_1a0,func->body);
  pPVar1 = local_1a0.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           .super_Pass.runner;
  for (pPVar4 = (PassRunner *)
                local_1a0.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .super_Pass._vptr_Pass; pPVar4 != pPVar1; pPVar4 = (PassRunner *)&pPVar4->wasm) {
    if (*(code *)(pPVar4->_vptr_PassRunner + 8) == (code)0x1) {
      pFVar3 = Module::getFunction(wasm,(Name)((IString *)(pPVar4->_vptr_PassRunner + 6))->str);
      SVar5 = HeapType::getSignature(&pFVar3->type);
      bVar2 = getResultsLUB::anon_class_16_2_38787349::operator()
                        ((anon_class_16_2_38787349 *)local_60,SVar5.results.id);
      if (!bVar2) {
        std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&local_1a0);
        return (LUBFinder)originalType.id;
      }
    }
  }
  std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
            ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&local_1a0);
  FindAll<wasm::CallIndirect>::FindAll((FindAll<wasm::CallIndirect> *)&local_1a0,func->body);
  pPVar1 = local_1a0.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           .super_Pass.runner;
  for (pPVar4 = (PassRunner *)
                local_1a0.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .super_Pass._vptr_Pass; pPVar4 != pPVar1; pPVar4 = (PassRunner *)&pPVar4->wasm) {
    if (*(code *)(pPVar4->_vptr_PassRunner + 10) == (code)0x1) {
      SVar5 = HeapType::getSignature((HeapType *)(pPVar4->_vptr_PassRunner + 2));
      bVar2 = getResultsLUB::anon_class_16_2_38787349::operator()
                        ((anon_class_16_2_38787349 *)local_60,SVar5.results.id);
      if (!bVar2) {
        std::_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::
        ~_Vector_base((_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_> *)
                      &local_1a0);
        return (LUBFinder)originalType.id;
      }
    }
  }
  std::_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::~_Vector_base
            ((_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_> *)&local_1a0
            );
  FindAll<wasm::CallRef>::FindAll((FindAll<wasm::CallRef> *)&local_1a0,func->body);
  for (; (PassRunner *)
         local_1a0.
         super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
         .super_Pass._vptr_Pass !=
         local_1a0.
         super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
         .super_Pass.runner;
      local_1a0.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_Pass._vptr_Pass =
           (_func_int **)
           &((PassRunner *)
            local_1a0.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass._vptr_Pass)->wasm) {
    if ((*(code *)(((PassRunner *)
                   local_1a0.
                   super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                   .super_Pass._vptr_Pass)->_vptr_PassRunner + 7) == (code)0x1) &&
       (processReturnType.originalType =
             *(Type **)(((PassRunner *)
                        local_1a0.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .super_Pass._vptr_Pass)->_vptr_PassRunner[6] + 8),
       processReturnType.originalType != (Type *)0x1)) {
      targetType.id = (uintptr_t)wasm::Type::getHeapType((Type *)&processReturnType.originalType);
      SVar5 = HeapType::getSignature((HeapType *)&targetType);
      bVar2 = getResultsLUB::anon_class_16_2_38787349::operator()
                        ((anon_class_16_2_38787349 *)local_60,SVar5.results.id);
      if (!bVar2) break;
    }
  }
  std::_Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~_Vector_base
            ((_Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&local_1a0);
  return (LUBFinder)(Type)originalType.id;
}

Assistant:

LUBFinder getResultsLUB(Function* func, Module& wasm) {
  LUBFinder lub;

  if (!wasm.features.hasGC()) {
    return lub;
  }

  Type originalType = func->getResults();
  if (!originalType.hasRef()) {
    // Nothing to refine.
    return lub;
  }

  // Before we do anything, we must refinalize the function, because otherwise
  // its body may contain a block with a forced type,
  //
  // (func (result X)
  //  (block (result X)
  //   (..content with more specific type Y..)
  //  )
  ReFinalize().walkFunctionInModule(func, &wasm);

  lub.note(func->body->type);
  if (lub.getLUB() == originalType) {
    return lub;
  }

  // Scan the body and look at the returns. First, return expressions.
  for (auto* ret : FindAll<Return>(func->body).list) {
    lub.note(ret->value->type);
    if (lub.getLUB() == originalType) {
      return lub;
    }
  }

  // Process return_calls and call_refs. Unlike return expressions which we
  // just handled, these only get a type to update, not a value.
  auto processReturnType = [&](Type type) {
    // Return whether we still look ok to do the optimization. If this is
    // false then we can stop here.
    lub.note(type);
    return lub.getLUB() != originalType;
  };

  for (auto* call : FindAll<Call>(func->body).list) {
    if (call->isReturn &&
        !processReturnType(wasm.getFunction(call->target)->getResults())) {
      return lub;
    }
  }
  for (auto* call : FindAll<CallIndirect>(func->body).list) {
    if (call->isReturn &&
        !processReturnType(call->heapType.getSignature().results)) {
      return lub;
    }
  }
  for (auto* call : FindAll<CallRef>(func->body).list) {
    if (call->isReturn) {
      auto targetType = call->target->type;
      if (targetType == Type::unreachable) {
        continue;
      }
      if (!processReturnType(targetType.getHeapType().getSignature().results)) {
        return lub;
      }
    }
  }

  return lub;
}